

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-val.c
# Opt level: O2

wchar_t borg_lookup_sval_fail(wchar_t tval,char *name)

{
  wchar_t wVar1;
  char *what;
  
  wVar1 = lookup_sval(tval,name);
  if (wVar1 == L'\xffffffff') {
    what = format("**STARTUP FAILURE** sval lookup failure - %s ",name);
    borg_note(what);
    borg_init_failure = true;
  }
  return wVar1;
}

Assistant:

static int borg_lookup_sval_fail(int tval, const char *name)
{
    int sval = lookup_sval(tval, name);
    if (sval == -1) {
        borg_note(
            format("**STARTUP FAILURE** sval lookup failure - %s ", name));
        borg_init_failure = true;
    }
    return sval;
}